

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

bool __thiscall cmGeneratedFileStreamBase::Close(cmGeneratedFileStreamBase *this)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  cmAlphaNum local_c8;
  cmAlphaNum local_98;
  undefined1 local_68 [8];
  string gzname;
  undefined1 local_38 [8];
  string resname;
  bool replaced;
  cmGeneratedFileStreamBase *this_local;
  
  resname.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)local_38,(string *)this);
  if (((this->Compress & 1U) != 0) && ((this->CompressExtraExtension & 1U) != 0)) {
    std::__cxx11::string::operator+=((string *)local_38,".gz");
  }
  uVar4 = std::__cxx11::string::empty();
  if ((((uVar4 & 1) == 0) && ((this->Okay & 1U) != 0)) &&
     (((this->CopyIfDifferent & 1U) == 0 ||
      (bVar2 = cmsys::SystemTools::FilesDiffer(&this->TempName,(string *)local_38), bVar2)))) {
    if ((this->Compress & 1U) == 0) {
      RenameFile(this,&this->TempName,(string *)local_38);
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_98,&this->TempName);
      cmAlphaNum::cmAlphaNum(&local_c8,".temp.gz");
      cmStrCat<>((string *)local_68,&local_98,&local_c8);
      iVar3 = CompressFile(this,&this->TempName,(string *)local_68);
      if (iVar3 != 0) {
        RenameFile(this,(string *)local_68,(string *)local_38);
      }
      cmsys::SystemTools::RemoveFile((string *)local_68);
      std::__cxx11::string::~string((string *)local_68);
    }
    resname.field_2._M_local_buf[0xf] = '\x01';
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    cmsys::SystemTools::RemoveFile(&this->TempName);
  }
  uVar1 = resname.field_2._M_local_buf[0xf];
  std::__cxx11::string::~string((string *)local_38);
  return (bool)(uVar1 & 1);
}

Assistant:

bool cmGeneratedFileStreamBase::Close()
{
  bool replaced = false;

  std::string resname = this->Name;
  if (this->Compress && this->CompressExtraExtension) {
    resname += ".gz";
  }

  // Only consider replacing the destination file if no error
  // occurred.
  if (!this->Name.empty() && this->Okay &&
      (!this->CopyIfDifferent ||
       cmSystemTools::FilesDiffer(this->TempName, resname))) {
    // The destination is to be replaced.  Rename the temporary to the
    // destination atomically.
    if (this->Compress) {
      std::string gzname = cmStrCat(this->TempName, ".temp.gz");
      if (this->CompressFile(this->TempName, gzname)) {
        this->RenameFile(gzname, resname);
      }
      cmSystemTools::RemoveFile(gzname);
    } else {
      this->RenameFile(this->TempName, resname);
    }

    replaced = true;
  }

  // Else, the destination was not replaced.
  //
  // Always delete the temporary file. We never want it to stay around.
  if (!this->TempName.empty()) {
    cmSystemTools::RemoveFile(this->TempName);
  }

  return replaced;
}